

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void wiz_drop_object(object *obj)

{
  loc grid;
  player *ppVar1;
  uint8_t uVar2;
  object *in_RDI;
  object *local_10;
  
  if (in_RDI != (object *)0x0) {
    in_RDI->origin = '\x13';
    local_10 = in_RDI;
    uVar2 = convert_depth_to_origin((int)player->depth);
    local_10->origin_depth = uVar2;
    ppVar1 = player;
    local_10->origin_place = player->place;
    grid.x = (ppVar1->grid).x;
    grid.y = (ppVar1->grid).y;
    drop_near((chunk *)cave,&local_10,L'\0',grid,true,true);
  }
  return;
}

Assistant:

static void wiz_drop_object(struct object *obj)
{
	if (obj == NULL) return;

	/* Mark as cheat and where it was created */
	obj->origin = ORIGIN_CHEAT;
	obj->origin_depth = convert_depth_to_origin(player->depth);
	obj->origin_place = player->place;

	/* Drop the object from heaven. */
	drop_near(cave, &obj, 0, player->grid, true, true);
}